

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

settings_e * enum_settings_start(void)

{
  char *__name;
  DIR *pDVar1;
  settings_e *psVar2;
  
  __name = make_filename(4,(char *)0x0);
  pDVar1 = opendir(__name);
  safefree(__name);
  psVar2 = (settings_e *)safemalloc(1,8,0);
  psVar2->dp = (DIR *)pDVar1;
  return psVar2;
}

Assistant:

settings_e *enum_settings_start(void)
{
    DIR *dp;
    char *filename;

    filename = make_filename(INDEX_SESSIONDIR, NULL);
    dp = opendir(filename);
    sfree(filename);

    settings_e *toret = snew(settings_e);
    toret->dp = dp;
    return toret;
}